

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::SystemProduct
          (ChSystemDescriptor *this,ChVectorDynamic<> *result,ChVectorDynamic<> *x)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  pointer ppCVar3;
  ChVariables *pCVar4;
  ChKblock *pCVar5;
  ChConstraint *pCVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  pointer ppCVar10;
  char *__function;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *local_90;
  long local_88;
  long local_78;
  undefined8 uStack_70;
  pointer local_68;
  double *local_60;
  long local_58;
  double *local_48;
  long local_40;
  
  iVar8 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar8;
  iVar8 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar8 + (long)this->n_q);
  lVar11 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (lVar11 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar11 != 0) {
    memset((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar11 << 3);
  }
  ppCVar10 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_68 = (this->vstiffness).
             super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar3 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar11 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 3;
    lVar12 = 0;
    do {
      pCVar4 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12];
      if (pCVar4->disabled == false) {
        local_48 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
        local_40 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows;
        if (local_40 < 0 && local_48 != (double *)0x0) goto LAB_00794640;
        local_78 = 0;
        uStack_70 = 0;
        local_90 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
        local_88 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
        if (local_88 < 0 && local_90 != (double *)0x0) goto LAB_00794629;
        (*pCVar4->_vptr_ChVariables[7])(pCVar4,&local_48,&local_90);
        if (local_78 != 0) {
          free(*(void **)(local_78 + -8));
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  if (ppCVar3 != local_68) {
    lVar11 = (long)ppCVar3 - (long)local_68 >> 3;
    lVar12 = 0;
    do {
      local_58 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
      pCVar5 = (this->vstiffness).
               super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      local_60 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      if (local_58 < 0 && local_60 != (double *)0x0) goto LAB_00794640;
      local_78 = 0;
      uStack_70 = 0;
      local_90 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      local_88 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
      if (local_88 < 0 && local_90 != (double *)0x0) goto LAB_00794629;
      (*pCVar5->_vptr_ChKblock[4])(pCVar5,&local_60,&local_90);
      if (local_78 != 0) {
        free(*(void **)(local_78 + -8));
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  if (ppCVar2 != ppCVar10) {
    lVar12 = (long)ppCVar2 - (long)ppCVar10 >> 3;
    lVar11 = 0;
    do {
      pCVar6 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11];
      if (pCVar6->active == true) {
        lVar9 = (long)this->n_q + (long)pCVar6->offset;
        if (((int)lVar9 < 0) ||
           ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            lVar9)) goto LAB_0079465f;
        (*pCVar6->_vptr_ChConstraint[10])
                  ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[lVar9],pCVar6,result);
      }
      lVar11 = lVar11 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
    if (ppCVar2 != ppCVar10) {
      ppCVar10 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        pCVar6 = ppCVar10[lVar11];
        if (pCVar6->active == true) {
          lVar9 = (long)this->n_q + (long)pCVar6->offset;
          if (((int)lVar9 < 0) ||
             ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar9)) {
LAB_0079467e:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          (*pCVar6->_vptr_ChConstraint[9])
                    (pCVar6,(result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                            .m_storage.m_data + lVar9,x);
          if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= lVar9) {
LAB_0079465f:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          if ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar9) goto LAB_0079467e;
          ppCVar10 = (this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pdVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          auVar14._8_8_ = 0;
          auVar14._0_8_ =
               (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [lVar9];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = ppCVar10[lVar11]->cfm_i;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar7[lVar9];
          auVar1 = vfmadd213sd_fma(auVar14,auVar13,auVar1);
          pdVar7[lVar9] = auVar1._0_8_;
        }
        lVar11 = lVar11 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
    }
  }
  return;
LAB_00794640:
  __function = 
  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
  ;
  goto LAB_00794655;
LAB_00794629:
  uStack_70 = 0;
  local_78 = 0;
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
  ;
LAB_00794655:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

void ChSystemDescriptor::SystemProduct(ChVectorDynamic<>& result, const ChVectorDynamic<>& x) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    result.setZero(n_q + n_c);

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();
    auto vs_size = vstiffness.size();

    // 1) First row: result.q part =  [M + K]*x.q + [Cq']*x.l

    // 1.1)  do  M*x.q
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->MultiplyAndAdd(result, x, c_a);
        }
    }

    // 1.2)  add also K*x.q  (NON straight parallelizable - risk of concurrency in writing)
    for (size_t ik = 0; ik < vs_size; ik++) {
        vstiffness[ik]->MultiplyAndAdd(result, x);
    }

    // 1.3)  add also [Cq]'*x.l  (NON straight parallelizable - risk of concurrency in writing)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->MultiplyTandAdd(result, x(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    // 2) Second row: result.l part =  [C_q]*x.q + [E]*x.l
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            int s_c = vconstraints[ic]->GetOffset() + n_q;
            vconstraints[ic]->MultiplyAndAdd(result(s_c), x);       // result.l_i += [C_q_i]*x.q
            result(s_c) += vconstraints[ic]->Get_cfm_i() * x(s_c);  // result.l_i += [E]*x.l_i
        }
    }
}